

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall fasttext::Model::initSigmoid(Model *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float local_1c;
  
  for (iVar1 = 0; iVar1 != 0x2010; iVar1 = iVar1 + 0x10) {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar2 = vxorps_avx512vl(ZEXT416((uint)((float)iVar1 * 0.001953125 + -8.0)),auVar2);
    fVar3 = expf(auVar2._0_4_);
    local_1c = 1.0 / (fVar3 + 1.0);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&this->t_sigmoid_,&local_1c);
  }
  return;
}

Assistant:

void Model::initSigmoid() {
	for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
		real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
		t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
	}
}